

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O0

void Sbc_ManDetectMultTest(Wlc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  Gia_Man_t *pGia;
  Vec_Int_t *p_00;
  Vec_Int_t *vGia2Out_00;
  int iObjFound;
  Vec_Int_t *vGia2Out;
  Vec_Int_t *vIns;
  Gia_Man_t *p;
  int fVerbose_local;
  Wlc_Ntk_t *pNtk_local;
  
  pGia = Wlc_NtkBitBlast(pNtk,(Wlc_BstPar_t *)0x0);
  p_00 = Sdb_StoComputeCutsDetect(pGia);
  if (((p_00 != (Vec_Int_t *)0x0) && (iVar1 = Vec_IntSize(p_00), iVar1 != 0)) &&
     (iVar1 = Vec_IntSize(p_00), iVar1 % 2 == 0)) {
    vGia2Out_00 = Sbc_ManDetectMult(pGia,p_00);
    iVar1 = Vec_IntSize(p_00);
    Sbc_ManWlcNodes(pNtk,pGia,vGia2Out_00,iVar1);
    Vec_IntFree(vGia2Out_00);
    Vec_IntFree(p_00);
    Gia_ManStop(pGia);
    return;
  }
  printf("Input identification did not work out.\n");
  return;
}

Assistant:

void Sbc_ManDetectMultTest( Wlc_Ntk_t * pNtk, int fVerbose )
{
    extern Vec_Int_t * Sdb_StoComputeCutsDetect( Gia_Man_t * pGia );
    Gia_Man_t * p = Wlc_NtkBitBlast( pNtk, NULL );//, -1, 0, 0, 0, 0, 1, 0, 0 ); // <= no cleanup
    Vec_Int_t * vIns, * vGia2Out;
    int iObjFound = -1;
//    Gia_Obj_t * pObj; int i;
//    Gia_ManForEachCo( p, pObj, i )
//        printf( "Output %2d - driver %5d (%d)\n", i, Gia_ObjFaninId0p(p, pObj), Gia_ObjFaninC0(pObj) );

    vIns = Sdb_StoComputeCutsDetect( p );
    if ( vIns == NULL || Vec_IntSize(vIns) == 0 || (Vec_IntSize(vIns) % 2) != 0 )
    {
        printf( "Input identification did not work out.\n" );
        return;
    }

    vGia2Out = Sbc_ManDetectMult( p, vIns );

    iObjFound = Sbc_ManWlcNodes( pNtk, p, vGia2Out, Vec_IntSize(vIns) );

    Vec_IntFree( vGia2Out );
    Vec_IntFree( vIns );

    Gia_ManStop( p );
}